

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cg.c
# Opt level: O0

void set_dimen_values(dill_stream s,sm_ref top,sm_ref this,int dimension)

{
  int in_ECX;
  sm_ref in_RDX;
  dill_stream in_RSI;
  long size;
  undefined4 in_stack_00000008;
  undefined8 uVar1;
  undefined4 in_stack_ffffffffffffffe0;
  
  uVar1 = 0xffffffffffffffff;
  if (in_RDX->node_type == cod_array_type_decl) {
    if ((in_RDX->node).compound_statement.statements != (sm_list)0x0) {
      evaluate_constant_expr((dill_stream)top,this,(long *)CONCAT44(dimension,in_stack_00000008));
      *(int *)(*(long *)&in_RSI[1].dill_local_pointer + 8 + (long)in_ECX * 0x10) = (int)uVar1;
    }
    set_dimen_values(in_RSI,in_RDX,(sm_ref)CONCAT44(in_ECX,in_stack_ffffffffffffffe0),
                     (int)((ulong)uVar1 >> 0x20));
  }
  return;
}

Assistant:

static void
set_dimen_values(dill_stream s, sm_ref top, sm_ref this, int dimension)
{
    long size = -1;
    if (this->node_type != cod_array_type_decl) return;
    if (this->node.array_type_decl.size_expr) {
	evaluate_constant_expr(s, this->node.array_type_decl.size_expr, &size);
	top->node.array_type_decl.dimensions->dimens[dimension].static_size = size;
    }
    set_dimen_values(s, top, this->node.array_type_decl.element_ref, dimension+1);
}